

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Instructions.h
# Opt level: O0

int __thiscall
flow::UnaryInstr<(flow::UnaryOperator)3,_(flow::LiteralType)2>::clone
          (UnaryInstr<(flow::UnaryOperator)3,_(flow::LiteralType)2> *this,__fn *__fn,
          void *__child_stack,int __flags,void *__arg,...)

{
  Value *local_28;
  unique_ptr<flow::UnaryInstr<(flow::UnaryOperator)3,_(flow::LiteralType)2>,_std::default_delete<flow::UnaryInstr<(flow::UnaryOperator)3,_(flow::LiteralType)2>_>_>
  local_20;
  undefined1 local_18 [8];
  UnaryInstr<(flow::UnaryOperator)3,_(flow::LiteralType)2> *this_local;
  
  local_18 = (undefined1  [8])__fn;
  this_local = this;
  local_28 = Instr::operand((Instr *)__fn,0);
  Value::name_abi_cxx11_((Value *)__fn);
  std::
  make_unique<flow::UnaryInstr<(flow::UnaryOperator)3,(flow::LiteralType)2>,flow::Value*,std::__cxx11::string_const&>
            ((Value **)&local_20,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_28);
  std::unique_ptr<flow::Instr,std::default_delete<flow::Instr>>::
  unique_ptr<flow::UnaryInstr<(flow::UnaryOperator)3,(flow::LiteralType)2>,std::default_delete<flow::UnaryInstr<(flow::UnaryOperator)3,(flow::LiteralType)2>>,void>
            ((unique_ptr<flow::Instr,std::default_delete<flow::Instr>> *)this,&local_20);
  std::
  unique_ptr<flow::UnaryInstr<(flow::UnaryOperator)3,_(flow::LiteralType)2>,_std::default_delete<flow::UnaryInstr<(flow::UnaryOperator)3,_(flow::LiteralType)2>_>_>
  ::~unique_ptr(&local_20);
  return (int)this;
}

Assistant:

std::unique_ptr<Instr> clone() override {
    return std::make_unique<UnaryInstr<Operator, ResultType>>(operand(0), name());
  }